

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring_checked.hh
# Opt level: O1

uint64_t __thiscall doublechecked::Roaring::or_cardinality(Roaring *this,Roaring *r)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_header *p_Var2;
  _Rb_tree_color _Var3;
  uint64_t uVar4;
  long lVar5;
  _Base_ptr p_Var6;
  _Base_ptr p_Var7;
  int line;
  uint64_t uVar8;
  char *expression;
  unsigned_long result;
  
  uVar4 = roaring_bitmap_or_cardinality((roaring_bitmap_t *)this,(roaring_bitmap_t *)r);
  p_Var6 = (this->check)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(this->check)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var6 == p_Var1) {
    result = (unsigned_long)(uVar4 == (r->check)._M_t._M_impl.super__Rb_tree_header._M_node_count);
    expression = "ans == r.check.size()";
    line = 0x1d4;
  }
  else {
    p_Var7 = (r->check)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var2 = &(r->check)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var7 == p_Var2) {
      result = (unsigned_long)
               (uVar4 == (this->check)._M_t._M_impl.super__Rb_tree_header._M_node_count);
      expression = "ans == check.size()";
      line = 0x1d7;
    }
    else {
      _Var3 = p_Var6[1]._M_color;
      lVar5 = std::_Rb_tree_decrement(&p_Var2->_M_header);
      if ((*(_Rb_tree_color *)(lVar5 + 0x20) < _Var3) ||
         (_Var3 = p_Var7[1]._M_color, lVar5 = std::_Rb_tree_decrement(&p_Var1->_M_header),
         *(_Rb_tree_color *)(lVar5 + 0x20) < _Var3)) {
        result = (unsigned_long)
                 (uVar4 == (r->check)._M_t._M_impl.super__Rb_tree_header._M_node_count +
                           (this->check)._M_t._M_impl.super__Rb_tree_header._M_node_count);
        expression = "ans == check.size() + r.check.size()";
        line = 0x1db;
      }
      else {
        uVar8 = 0;
        if ((_Rb_tree_header *)p_Var7 != p_Var2 || (_Rb_tree_header *)p_Var6 != p_Var1) {
          do {
            if ((_Rb_tree_header *)p_Var6 == p_Var1) {
LAB_00106efa:
              p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
            }
            else {
              if ((_Rb_tree_header *)p_Var7 != p_Var2) {
                if (p_Var6[1]._M_color == p_Var7[1]._M_color) {
                  p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
                }
                else if (p_Var6[1]._M_color < p_Var7[1]._M_color) goto LAB_00106eed;
                goto LAB_00106efa;
              }
LAB_00106eed:
              p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
            }
            uVar8 = uVar8 + 1;
          } while (((_Rb_tree_header *)p_Var6 != p_Var1) || ((_Rb_tree_header *)p_Var7 != p_Var2));
        }
        result = (unsigned_long)(uVar4 == uVar8);
        expression = "ans == count";
        line = 0x1ee;
      }
    }
  }
  _assert_true(result,expression,
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring_checked.hh"
               ,line);
  return uVar4;
}

Assistant:

uint64_t or_cardinality(const Roaring &r) const {
        uint64_t ans = plain.or_cardinality(r.plain);

        auto it = check.begin();
        auto it_end = check.end();
        auto r_it = r.check.begin();
        auto r_it_end = r.check.end();
        if (it == it_end) {
            assert_true(ans == r.check.size());
        }  // this empty
        else if (r_it == r_it_end) {
            assert_true(ans == check.size());
        }  // r empty
        else if (*it > *r.check.rbegin() || *r_it > *check.rbegin()) {
            assert_true(ans ==
                        check.size() + r.check.size());  // obvious disjoint
        } else {
            uint64_t count = 0;
            while (it != it_end || r_it != r_it_end) {
                ++count;  // note matching case counts once but bumps both
                if (it == it_end) {
                    ++r_it;
                } else if (r_it == r_it_end) {
                    ++it;
                } else if (*it == *r_it) {
                    ++it;
                    ++r_it;
                }  // matching case
                else if (*it < *r_it) {
                    ++it;
                } else {
                    ++r_it;
                }
            }
            assert_true(ans == count);
        }

        return ans;
    }